

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O3

SubtreeArray ts_subtree_array_remove_trailing_extras(SubtreeArray *self)

{
  SubtreeHeapData *pSVar1;
  Subtree SVar2;
  long lVar3;
  undefined8 uVar4;
  Subtree *pSVar5;
  uint uVar6;
  uint32_t uVar7;
  int iVar8;
  uint uVar9;
  long extraout_RDX;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long *__nmemb;
  uint uVar14;
  SubtreeArray SVar15;
  SubtreeArray SVar16;
  
  if (self->size == 0) {
    uVar12 = 0;
    pSVar5 = (Subtree *)0x0;
  }
  else {
    pSVar5 = (Subtree *)0x0;
    uVar11 = 0;
    uVar7 = self->size;
    do {
      uVar14 = uVar7 - 1;
      pSVar1 = self->contents[uVar14].ptr;
      if (((ulong)pSVar1 & 1) == 0) {
        uVar9 = *(uint *)&pSVar1->field_0x2c >> 2;
      }
      else {
        uVar9 = (uint)((ulong)pSVar1 >> 3) & 0x1fffffff;
      }
      uVar12 = uVar11;
      if ((uVar9 & 1) == 0) goto LAB_0013295e;
      uVar9 = (uint)uVar11;
      if (uVar9 == (uint)(uVar11 >> 0x20)) {
        uVar6 = uVar9 * 2;
        if (uVar6 < 9) {
          uVar6 = 8;
        }
        if (uVar9 < uVar6) {
          __nmemb = (long *)(ulong)uVar6;
          if (pSVar5 == (Subtree *)0x0) {
            pSVar5 = (Subtree *)calloc((size_t)__nmemb,8);
            if (pSVar5 == (Subtree *)0x0) goto LAB_001329b1;
          }
          else {
            pSVar5 = (Subtree *)realloc(pSVar5,(long)__nmemb * 8);
            if (pSVar5 == (Subtree *)0x0) {
              ts_subtree_array_remove_trailing_extras_cold_1();
LAB_001329b1:
              ts_subtree_array_remove_trailing_extras_cold_2();
              pSVar5 = (Subtree *)(ulong)*(uint *)(__nmemb + 1);
              lVar10 = extraout_RDX;
              if ((Subtree *)&DAT_00000001 < pSVar5) {
                pSVar5 = (Subtree *)(ulong)(*(uint *)(__nmemb + 1) >> 1);
                iVar8 = -1;
                lVar10 = 0;
                do {
                  uVar12 = (ulong)(uint)((int)__nmemb[1] + iVar8);
                  lVar3 = *__nmemb;
                  uVar4 = *(undefined8 *)(lVar3 + lVar10 * 8);
                  *(undefined8 *)(lVar3 + lVar10 * 8) = *(undefined8 *)(lVar3 + uVar12 * 8);
                  *(undefined8 *)(*__nmemb + uVar12 * 8) = uVar4;
                  lVar10 = lVar10 + 1;
                  iVar8 = iVar8 + -1;
                } while (pSVar5 != (Subtree *)lVar10);
              }
              SVar16.size = (int)lVar10;
              SVar16.capacity = (int)((ulong)lVar10 >> 0x20);
              SVar16.contents = pSVar5;
              return SVar16;
            }
          }
          uVar11 = uVar11 & 0xffffffff | (long)__nmemb << 0x20;
        }
      }
      uVar12 = uVar11 & 0xffffffff00000000 | (ulong)((int)uVar11 + 1);
      pSVar5[uVar11 & 0xffffffff].ptr = pSVar1;
      uVar11 = uVar12;
      uVar7 = uVar14;
    } while (uVar14 != 0);
    uVar7 = 0;
LAB_0013295e:
    self->size = uVar7;
    if ((uVar12 & 0xfffffffe) != 0) {
      uVar13 = 0;
      uVar11 = uVar12;
      do {
        uVar11 = uVar11 - 1;
        SVar2 = pSVar5[uVar13];
        pSVar5[uVar13] = pSVar5[uVar11 & 0xffffffff];
        pSVar5[uVar11 & 0xffffffff] = SVar2;
        uVar13 = uVar13 + 1;
      } while ((uVar12 >> 1 & 0x7fffffff) != uVar13);
    }
  }
  SVar15.size = (int)uVar12;
  SVar15.capacity = (int)(uVar12 >> 0x20);
  SVar15.contents = pSVar5;
  return SVar15;
}

Assistant:

SubtreeArray ts_subtree_array_remove_trailing_extras(SubtreeArray *self) {
  SubtreeArray result = array_new();

  uint32_t i = self->size - 1;
  for (; i + 1 > 0; i--) {
    Subtree child = self->contents[i];
    if (!ts_subtree_extra(child)) break;
    array_push(&result, child);
  }

  self->size = i + 1;
  ts_subtree_array_reverse(&result);
  return result;
}